

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O1

void t9(int pi)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  uint32_t p [10];
  undefined8 local_58 [4];
  uint local_34;
  
  puts("Script store/run/status/stop/delete tests.");
  gpio_write(pi,0x19,0);
  uVar1 = callback(pi,0x19,0,t9cbf);
  uVar2 = store_script(pi,"   ld p9 p0   tag 0   w p1 1   mils 5   w p1 0   mils 5   dcr p9   jp 0")
  ;
  do {
    time_sleep(0x3fb999999999999a);
    iVar3 = script_status(pi,uVar2,local_58);
    iVar4 = t9_count;
  } while (iVar3 == 0);
  local_58[0] = 0x1900000063;
  run_script(pi,uVar2,2,local_58);
  time_sleep(0x4000000000000000);
  CHECK(9,1,t9_count - iVar4,100,0,"store/run script");
  iVar4 = t9_count;
  local_58[0] = 0x19000000c8;
  run_script(pi,uVar2,2,local_58);
  do {
    time_sleep(0x3fb999999999999a);
    iVar3 = script_status(pi,uVar2,local_58);
  } while (iVar3 == 2);
  iVar4 = t9_count - iVar4;
  time_sleep(0x3fb999999999999a);
  CHECK(9,2,iVar4,0xc9,0,"run script/script status");
  iVar4 = t9_count;
  local_58[0] = 0x19000007d0;
  run_script(pi,uVar2,2,local_58);
  time_sleep(0x3fb999999999999a);
  iVar3 = script_status(pi,uVar2,local_58);
  while (iVar3 == 2) {
    if (local_34 < 0x640) {
      stop_script(pi,uVar2);
    }
    time_sleep(0x3fb999999999999a);
    iVar3 = script_status(pi,uVar2,local_58);
  }
  iVar4 = t9_count - iVar4;
  time_sleep(0x3fb999999999999a);
  CHECK(9,3,iVar4,0x19a,10,"run/stop script/script status");
  iVar4 = delete_script(pi,uVar2);
  CHECK(9,4,iVar4,0,0,"delete script");
  callback_cancel(uVar1);
  return;
}

Assistant:

void t9(int pi)
{
   int s, oc, c, e, id;
   uint32_t p[10];

   printf("Script store/run/status/stop/delete tests.\n");

   gpio_write(pi, GPIO, 0); /* need known state */

   /*
   100 loops per second
   p0 number of loops
   p1 GPIO
   */
   char *script="\
   ld p9 p0\
   tag 0\
   w p1 1\
   mils 5\
   w p1 0\
   mils 5\
   dcr p9\
   jp 0";

   id = callback(pi, GPIO, RISING_EDGE, t9cbf);

   s = store_script(pi, script);

   /* Wait for script to finish initing. */
   while (1)
   {
      time_sleep(0.1);
      e = script_status(pi, s, p);
      if (e != PI_SCRIPT_INITING) break;
   }

   oc = t9_count;
   p[0] = 99;
   p[1] = GPIO;
   run_script(pi, s, 2, p);
   time_sleep(2);
   c = t9_count - oc;
   CHECK(9, 1, c, 100, 0, "store/run script");

   oc = t9_count;
   p[0] = 200;
   p[1] = GPIO;
   run_script(pi, s, 2, p);
   while (1)
   {
      time_sleep(0.1);
      e = script_status(pi, s, p);
      if (e != PI_SCRIPT_RUNNING) break;
   }
   c = t9_count - oc;
   time_sleep(0.1);
   CHECK(9, 2, c, 201, 0, "run script/script status");

   oc = t9_count;
   p[0] = 2000;
   p[1] = GPIO;
   run_script(pi, s, 2, p);
   while (1)
   {
      time_sleep(0.1);
      e = script_status(pi, s, p);
      if (e != PI_SCRIPT_RUNNING) break;
      if (p[9] < 1600) stop_script(pi, s);
   }
   c = t9_count - oc;
   time_sleep(0.1);
   CHECK(9, 3, c, 410, 10, "run/stop script/script status");

   e = delete_script(pi, s);
   CHECK(9, 4, e, 0, 0, "delete script");

   callback_cancel(id);
}